

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

int Lib::List<unsigned_int>::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  uint head;
  List<unsigned_int> *pLVar2;
  List<unsigned_int> *tmp;
  List<unsigned_int> *rest;
  List<unsigned_int> *previous;
  List<unsigned_int> *result;
  List<unsigned_int> *local_38;
  List<unsigned_int> *local_30;
  List<unsigned_int> *local_8;
  
  bVar1 = isEmpty((List<unsigned_int> *)dst);
  if (bVar1) {
    local_8 = empty();
  }
  else {
    local_8 = (List<unsigned_int> *)operator_new(0x857b62);
    head = List<unsigned_int>::head((List<unsigned_int> *)dst);
    List(local_8,head);
    local_38 = tail((List<unsigned_int> *)dst);
    local_30 = local_8;
    while( true ) {
      bVar1 = isEmpty(local_38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pLVar2 = (List<unsigned_int> *)operator_new(0x857bc6);
      List(pLVar2,local_38->_head);
      local_30->_tail = pLVar2;
      local_38 = local_38->_tail;
      local_30 = pLVar2;
    }
    pLVar2 = empty();
    local_30->_tail = pLVar2;
  }
  return (int)local_8;
}

Assistant:

static List* copy (const List* l)
  {
    if (isEmpty(l)) return empty();

    List* result = new List(l->head());
    List* previous = result;
    List* rest = l->tail();

    while (! isEmpty(rest)) {
      List* tmp = new List(rest->_head);
      previous->_tail = tmp;
      previous = tmp;
      rest = rest->_tail;
    }

    previous->_tail = empty();
    return result;
  }